

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int keycode,int scancode,int action,int mods)

{
  ImGuiKey key;
  int iVar1;
  ImGuiIO *this;
  ImGuiKey in_ECX;
  int in_EDX;
  int in_ESI;
  GLFWwindow *in_RDI;
  ImGuiKey in_R8D;
  ImGuiKey imgui_key;
  ImGuiIO *io;
  int keycode_to_mod;
  ImGui_ImplGlfw_Data *bd;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdb;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  this = (ImGuiIO *)ImGui_ImplGlfw_GetBackendData();
  if (((GLFWkeyfun)this->BackendLanguageUserData != (GLFWkeyfun)0x0) &&
     (in_RDI == *(GLFWwindow **)this)) {
    (*(code *)this->BackendLanguageUserData)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D);
  }
  if ((in_ECX == 1) || (in_ECX == ImGuiKey_KeysData_OFFSET)) {
    key = ImGui_ImplGlfw_KeyToModifier(in_ESI);
    if (key != ImGuiKey_KeysData_OFFSET) {
      if (in_ECX == 1) {
        in_R8D = in_R8D | key;
      }
      else {
        in_R8D = in_R8D & (key ^ ~ImGuiKey_KeysData_OFFSET);
      }
    }
    ImGui_ImplGlfw_UpdateKeyModifiers(iVar1);
    iVar1 = ImGui_ImplGlfw_TranslateUntranslatedKey((int)window,keycode);
    ImGui::GetIO();
    ImGui_ImplGlfw_KeyToImGuiKey(iVar1);
    ImGuiIO::AddKeyEvent(this,key,(bool)in_stack_ffffffffffffffdb);
    ImGuiIO::SetKeyEventNativeData
              ((ImGuiIO *)CONCAT44(iVar1,in_EDX),in_ECX,in_R8D,(int)((ulong)this >> 0x20),(int)this)
    ;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int keycode, int scancode, int action, int mods)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackKey != nullptr && window == bd->Window)
        bd->PrevUserCallbackKey(window, keycode, scancode, action, mods);

    if (action != GLFW_PRESS && action != GLFW_RELEASE)
        return;

    // Workaround: X11 does not include current pressed/released modifier key in 'mods' flags. https://github.com/glfw/glfw/issues/1630
    if (int keycode_to_mod = ImGui_ImplGlfw_KeyToModifier(keycode))
        mods = (action == GLFW_PRESS) ? (mods | keycode_to_mod) : (mods & ~keycode_to_mod);
    ImGui_ImplGlfw_UpdateKeyModifiers(mods);

    keycode = ImGui_ImplGlfw_TranslateUntranslatedKey(keycode, scancode);

    ImGuiIO& io = ImGui::GetIO();
    ImGuiKey imgui_key = ImGui_ImplGlfw_KeyToImGuiKey(keycode);
    io.AddKeyEvent(imgui_key, (action == GLFW_PRESS));
    io.SetKeyEventNativeData(imgui_key, keycode, scancode); // To support legacy indexing (<1.87 user code)
}